

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void OpenSteer::checkForDrawError(char *locationDescription)

{
  GLenum GVar1;
  ostream *poVar2;
  
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::operator<<(poVar2,"OpenSteerDemo: OpenGL error ");
    if (GVar1 - 0x500 < 6) {
      std::operator<<((ostream *)&std::cerr,
                      &DAT_00141414 + *(int *)(&DAT_00141414 + (ulong)(GVar1 - 0x500) * 4));
    }
    if (locationDescription != (char *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr," in ");
      std::operator<<(poVar2,locationDescription);
    }
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void 
OpenSteer::checkForDrawError (const char * locationDescription)
{
    checkForGLError (locationDescription);
}